

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::
createExternIfaceMethod<slang::syntax::ExternInterfaceMethodSyntax>
          (Scope *scope,ExternInterfaceMethodSyntax *syntax)

{
  DataTypeSyntax *newType;
  Type *newType_00;
  SubroutineSymbol *this;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  VariableLifetime unaff_retaddr;
  FunctionPortListSyntax *in_stack_00000008;
  Scope *in_stack_00000010;
  Scope *in_stack_00000018;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  MethodPrototypeSymbol *result;
  SubroutineKind subroutineKind;
  Token nameToken;
  FunctionPrototypeSyntax *proto;
  Compilation *comp;
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL> *in_stack_fffffffffffffed8;
  Token *in_stack_fffffffffffffee0;
  DeclaredType *in_stack_ffffffffffffff00;
  MethodPrototypeSymbol *in_stack_ffffffffffffff08;
  Compilation *compilation;
  Compilation *args_2;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  Compilation *in_stack_ffffffffffffff28;
  BumpAllocator *in_stack_ffffffffffffff30;
  pointer local_c8;
  MethodFlags *in_stack_ffffffffffffff40;
  bitmask<slang::ast::MethodFlags> local_a2;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_a0 [2];
  undefined2 local_5e;
  undefined4 local_5c;
  SourceLocation local_58;
  string_view local_50;
  MethodPrototypeSymbol *local_40;
  uint local_34;
  Token local_30;
  FunctionPrototypeSyntax *local_20;
  Compilation *local_18;
  SyntaxNode *local_10;
  
  local_10 = in_RSI;
  local_18 = Scope::getCompilation(in_RDI);
  local_20 = not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
                       ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0x9c9cfd);
  not_null<slang::syntax::NameSyntax_*>::operator->
            ((not_null<slang::syntax::NameSyntax_*> *)0x9c9d16);
  local_30 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)in_stack_ffffffffffffff00);
  local_34 = (uint)((local_20->keyword).kind == TaskKeyword);
  compilation = local_18;
  args_2 = local_18;
  local_50 = parsing::Token::valueText(in_stack_fffffffffffffee0);
  local_58 = parsing::Token::location(&local_30);
  local_5c = 0;
  local_5e = 0x10;
  local_40 = BumpAllocator::
             emplace<slang::ast::MethodPrototypeSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::SubroutineKind&,slang::ast::Visibility,slang::ast::MethodFlags>
                       (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                        in_stack_ffffffffffffff20,(SourceLocation *)args_2,
                        (SubroutineKind *)compilation,(Visibility *)in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff40);
  Symbol::setSyntax(&local_40->super_Symbol,local_10);
  if (local_34 == 0) {
    in_stack_ffffffffffffff08 = (MethodPrototypeSymbol *)&local_40->declaredReturnType;
    newType = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                        ((not_null<slang::syntax::DataTypeSyntax_*> *)0x9c9e35);
    DeclaredType::setTypeSyntax((DeclaredType *)in_stack_ffffffffffffff08,newType);
  }
  else {
    in_stack_ffffffffffffff00 = &local_40->declaredReturnType;
    newType_00 = Compilation::getVoidType(local_18);
    DeclaredType::setType(in_stack_ffffffffffffff00,newType_00);
  }
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x9c9e7c);
  src = extraout_RDX;
  if (local_20->portList != (FunctionPortListSyntax *)0x0) {
    local_a2 = SubroutineSymbol::buildArguments
                         (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                          (SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *)in_RDI);
    bitmask<slang::ast::MethodFlags>::operator|=(&local_40->flags,&local_a2);
    src = extraout_RDX_00;
  }
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
            (local_a0,(EVP_PKEY_CTX *)local_18,src);
  std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::FormalArgumentSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  (local_40->arguments)._M_ptr = local_c8;
  (local_40->arguments)._M_extent._M_extent_value = (size_t)in_stack_ffffffffffffff40;
  this = SubroutineSymbol::createFromPrototype
                   (compilation,in_stack_ffffffffffffff08,(Scope *)in_stack_ffffffffffffff00);
  std::optional<slang::ast::SubroutineSymbol_const*>::operator=
            ((optional<const_slang::ast::SubroutineSymbol_*> *)this,
             (SubroutineSymbol **)in_stack_fffffffffffffed8);
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> *)0x9c9fd5);
  return local_40;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::createExternIfaceMethod(const Scope& scope,
                                                                      const TSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto& proto = *syntax.prototype;
    auto nameToken = proto.name->getLastToken();
    auto subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                       : SubroutineKind::Function;

    auto result = comp.emplace<MethodPrototypeSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location(), subroutineKind,
                                                      Visibility::Public,
                                                      MethodFlags::InterfaceExtern);

    result->setSyntax(syntax);

    if (subroutineKind == SubroutineKind::Function)
        result->declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result->declaredReturnType.setType(comp.getVoidType());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result->flags |= SubroutineSymbol::buildArguments(*result, scope, *proto.portList,
                                                          VariableLifetime::Automatic, arguments);
    }

    result->arguments = arguments.copy(comp);
    result->subroutine = &SubroutineSymbol::createFromPrototype(comp, *result, scope);
    return *result;
}